

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void cpu_m68k_set_fpcr_m68k(CPUM68KState_conflict *env,uint32_t val)

{
  int iVar1;
  uint32_t val_local;
  CPUM68KState_conflict *env_local;
  
  env->fpcr = val & 0xffff;
  iVar1 = m68k_feature(env,9);
  if (iVar1 == 0) {
    m68k_restore_precision_mode(env);
  }
  else {
    cf_restore_precision_mode(env);
  }
  restore_rounding_mode(env);
  return;
}

Assistant:

void cpu_m68k_set_fpcr(CPUM68KState *env, uint32_t val)
{
    env->fpcr = val & 0xffff;

    if (m68k_feature(env, M68K_FEATURE_CF_FPU)) {
        cf_restore_precision_mode(env);
    } else {
        m68k_restore_precision_mode(env);
    }
    restore_rounding_mode(env);
}